

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86_avx512::create_pipeline_fp16s(InnerProduct_x86_avx512 *this,Option *opt)

{
  Mat *this_00;
  Mat *this_01;
  uint _h;
  size_t sVar1;
  void *pvVar2;
  _func_int *p_Var3;
  int *piVar4;
  void *pvVar5;
  unsigned_short uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int _w;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  unsigned_short *puVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  float *pfVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  Mat local_f8;
  long local_b0;
  void *local_a8;
  ulong local_a0;
  long local_98;
  long local_90;
  long local_88;
  Option *local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  this_01 = (Mat *)(&this->field_0x130 + (long)this->_vptr_InnerProduct_x86_avx512[-3]);
  _h = this_01[-2].h;
  uVar30 = (ulong)(int)_h;
  _w = this_01[-2].c / (int)_h;
  this_00 = &this->weight_data_tm;
  local_80 = opt;
  if (opt->use_packing_layout == true) {
    local_a0 = uVar30;
    if ((uVar30 & 0xf) == 0) {
      Mat::reshape(&local_f8,this_01,_w,_h,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)_h >> 4,0x20,0x10,(Allocator *)0x0);
      lVar18 = 8;
      lVar21 = 0xf;
      lVar24 = 0xe;
      lVar27 = 0xd;
      lVar7 = 0xc;
      lVar9 = 0xb;
      lVar11 = 10;
      lVar13 = 9;
      lVar34 = 7;
      local_120 = 6;
      local_128 = 5;
      local_130 = 4;
      local_138 = 3;
      local_88 = 2;
      local_90 = 1;
      local_98 = 0;
      for (uVar29 = 0; pvVar5 = local_f8.data, (long)(uVar29 | 0xf) < (long)uVar30;
          uVar29 = uVar29 + 0x10) {
        pvVar2 = (this->weight_data_tm).data;
        sVar1 = (this->weight_data_tm).elemsize;
        lVar37 = (long)(this->weight_data_tm).w;
        puVar31 = (unsigned_short *)((uVar29 >> 4) * lVar37 * sVar1 + (long)pvVar2);
        local_b0 = (long)local_f8.w;
        lVar39 = local_f8.elemsize * lVar21 * local_b0;
        lVar15 = local_f8.elemsize * lVar24 * local_b0;
        lVar17 = local_f8.elemsize * lVar27 * local_b0;
        lVar20 = local_f8.elemsize * lVar7 * local_b0;
        lVar23 = local_f8.elemsize * lVar9 * local_b0;
        lVar26 = local_f8.elemsize * lVar11 * local_b0;
        lVar28 = local_f8.elemsize * lVar13 * local_b0;
        lVar32 = local_f8.elemsize * lVar18 * local_b0;
        lVar37 = sVar1 * local_98 * lVar37;
        lVar33 = local_f8.elemsize * lVar34 * local_b0;
        lVar35 = local_f8.elemsize * local_120 * local_b0;
        lVar12 = local_f8.elemsize * local_128 * local_b0;
        lVar38 = local_f8.elemsize * local_130 * local_b0;
        lVar14 = local_f8.elemsize * local_138 * local_b0;
        lVar16 = local_f8.elemsize * local_88 * local_b0;
        lVar19 = local_f8.elemsize * local_90 * local_b0;
        lVar22 = local_f8.elemsize * uVar29 * local_b0;
        local_a8 = local_f8.data;
        lVar10 = 0;
        lVar25 = 0;
        for (iVar8 = 0; iVar8 + 0xf < _w; iVar8 = iVar8 + 0x10) {
          auVar55 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8.data + lVar25 + lVar22),
                                      3);
          auVar56 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8.data + lVar25 + lVar19),
                                      3);
          auVar57 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8.data + lVar25 + lVar16),
                                      3);
          auVar58 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8.data + lVar25 + lVar14),
                                      3);
          auVar40 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8.data + lVar25 + lVar38),
                                      3);
          auVar41 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8.data + lVar25 + lVar12),
                                      3);
          auVar42 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8.data + lVar25 + lVar35),
                                      3);
          auVar59 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8.data + lVar25 + lVar33),
                                      3);
          auVar43 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8.data + lVar25 + lVar32),
                                      3);
          auVar44 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8.data + lVar25 + lVar28),
                                      3);
          auVar45 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8.data + lVar25 + lVar26),
                                      3);
          auVar46 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8.data + lVar25 + lVar23),
                                      3);
          auVar47 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8.data + lVar25 + lVar20),
                                      3);
          auVar48 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8.data + lVar25 + lVar17),
                                      3);
          auVar49 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8.data + lVar25 + lVar15),
                                      3);
          auVar50 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8.data + lVar25 + lVar39),
                                      3);
          auVar51 = vpunpcklwd_avx512vl(auVar55,auVar56);
          auVar55 = vpunpckhwd_avx2(auVar55,auVar56);
          auVar60 = vpunpcklwd_avx2(auVar57,auVar58);
          auVar56 = vpunpckhwd_avx2(auVar57,auVar58);
          auVar61 = vpunpcklwd_avx2(auVar40,auVar41);
          auVar57 = vpunpckhwd_avx2(auVar40,auVar41);
          auVar62 = vpunpcklwd_avx2(auVar42,auVar59);
          auVar58 = vpunpckhwd_avx2(auVar42,auVar59);
          auVar74 = vpunpcklwd_avx2(auVar43,auVar44);
          auVar40 = vpunpckhwd_avx2(auVar43,auVar44);
          auVar43 = vpunpcklwd_avx2(auVar45,auVar46);
          auVar41 = vpunpckhwd_avx2(auVar45,auVar46);
          auVar44 = vpunpcklwd_avx2(auVar47,auVar48);
          auVar42 = vpunpckhwd_avx2(auVar47,auVar48);
          auVar45 = vpunpcklwd_avx2(auVar49,auVar50);
          auVar59 = vpunpckhwd_avx2(auVar49,auVar50);
          auVar46 = vpunpckldq_avx512vl(auVar51,auVar60);
          auVar47 = vpunpckhdq_avx512vl(auVar51,auVar60);
          auVar48 = vpunpckldq_avx512vl(auVar55,auVar56);
          auVar55 = vpunpckhdq_avx2(auVar55,auVar56);
          auVar60 = vpunpckldq_avx2(auVar61,auVar62);
          auVar56 = vpunpckhdq_avx2(auVar61,auVar62);
          auVar61 = vpunpckldq_avx2(auVar57,auVar58);
          auVar57 = vpunpckhdq_avx2(auVar57,auVar58);
          auVar62 = vpunpckldq_avx2(auVar74,auVar43);
          auVar58 = vpunpckhdq_avx2(auVar74,auVar43);
          auVar74 = vpunpckldq_avx2(auVar40,auVar41);
          auVar40 = vpunpckhdq_avx2(auVar40,auVar41);
          auVar43 = vpunpckldq_avx2(auVar44,auVar45);
          auVar41 = vpunpckhdq_avx2(auVar44,auVar45);
          auVar44 = vpunpckldq_avx2(auVar42,auVar59);
          auVar42 = vpunpckhdq_avx2(auVar42,auVar59);
          auVar45 = vpunpcklqdq_avx2(auVar46,auVar60);
          auVar59 = vpunpckhqdq_avx2(auVar46,auVar60);
          auVar60 = vpunpcklqdq_avx2(auVar47,auVar56);
          auVar56 = vpunpckhqdq_avx2(auVar47,auVar56);
          auVar46 = vpunpcklqdq_avx512vl(auVar48,auVar61);
          auVar47 = vpunpckhqdq_avx512vl(auVar48,auVar61);
          auVar48 = vpunpcklqdq_avx512vl(auVar55,auVar57);
          auVar55 = vpunpckhqdq_avx2(auVar55,auVar57);
          auVar61 = vpunpcklqdq_avx2(auVar62,auVar43);
          auVar57 = vpunpckhqdq_avx2(auVar62,auVar43);
          auVar62 = vpunpcklqdq_avx2(auVar58,auVar41);
          auVar58 = vpunpckhqdq_avx2(auVar58,auVar41);
          auVar43 = vpunpcklqdq_avx2(auVar74,auVar44);
          auVar41 = vpunpckhqdq_avx2(auVar74,auVar44);
          auVar74 = vpunpcklqdq_avx2(auVar40,auVar42);
          auVar40 = vpunpckhqdq_avx2(auVar40,auVar42);
          auVar77._0_16_ = ZEXT116(0) * auVar61._0_16_ + ZEXT116(1) * auVar45._0_16_;
          auVar77._16_16_ = ZEXT116(0) * auVar45._16_16_ + ZEXT116(1) * auVar61._0_16_;
          auVar44 = vinserti32x4_avx512vl(auVar59,auVar57._0_16_,1);
          auVar49 = vinserti32x4_avx512vl(auVar60,auVar62._0_16_,1);
          auVar50 = vinserti32x4_avx512vl(auVar56,auVar58._0_16_,1);
          auVar51 = vinserti32x4_avx512vl(auVar46,auVar43._0_16_,1);
          auVar52 = vinserti32x4_avx512vl(auVar47,auVar41._0_16_,1);
          auVar53 = vinserti32x4_avx512vl(auVar48,auVar74._0_16_,1);
          auVar54 = vinserti32x4_avx512vl(auVar55,auVar40._0_16_,1);
          auVar42 = vperm2i128_avx2(auVar45,auVar61,0x31);
          auVar57 = vperm2i128_avx2(auVar59,auVar57,0x31);
          auVar59 = vperm2i128_avx2(auVar60,auVar62,0x31);
          auVar56 = vperm2i128_avx2(auVar56,auVar58,0x31);
          auVar58 = vperm2i128_avx2(auVar46,auVar43,0x31);
          auVar41 = vperm2i128_avx2(auVar47,auVar41,0x31);
          auVar60 = vshufi64x2_avx512vl(auVar48,auVar74,3);
          auVar40 = vperm2i128_avx2(auVar55,auVar40,0x31);
          *(undefined1 (*) [32])((long)pvVar2 + lVar25 * 8 + lVar37) = auVar77;
          auVar55 = vmovdqu64_avx512vl(auVar44);
          *(undefined1 (*) [32])((long)pvVar2 + lVar25 * 8 + lVar37 + 0x20) = auVar55;
          auVar55 = vmovdqu64_avx512vl(auVar49);
          *(undefined1 (*) [32])((long)pvVar2 + lVar25 * 8 + lVar37 + 0x40) = auVar55;
          auVar55 = vmovdqu64_avx512vl(auVar50);
          *(undefined1 (*) [32])((long)pvVar2 + lVar25 * 8 + lVar37 + 0x60) = auVar55;
          auVar55 = vmovdqu64_avx512vl(auVar51);
          *(undefined1 (*) [32])((long)pvVar2 + lVar25 * 8 + lVar37 + 0x80) = auVar55;
          auVar55 = vmovdqu64_avx512vl(auVar52);
          *(undefined1 (*) [32])((long)pvVar2 + lVar25 * 8 + lVar37 + 0xa0) = auVar55;
          auVar55 = vmovdqu64_avx512vl(auVar53);
          *(undefined1 (*) [32])((long)pvVar2 + lVar25 * 8 + lVar37 + 0xc0) = auVar55;
          auVar55 = vmovdqu64_avx512vl(auVar54);
          *(undefined1 (*) [32])((long)pvVar2 + lVar25 * 8 + lVar37 + 0xe0) = auVar55;
          *(undefined1 (*) [32])((long)pvVar2 + lVar25 * 8 + lVar37 + 0x100) = auVar42;
          *(undefined1 (*) [32])((long)pvVar2 + lVar25 * 8 + lVar37 + 0x120) = auVar57;
          *(undefined1 (*) [32])((long)pvVar2 + lVar25 * 8 + lVar37 + 0x140) = auVar59;
          *(undefined1 (*) [32])((long)pvVar2 + lVar25 * 8 + lVar37 + 0x160) = auVar56;
          *(undefined1 (*) [32])((long)pvVar2 + lVar25 * 8 + lVar37 + 0x180) = auVar58;
          *(undefined1 (*) [32])((long)pvVar2 + lVar25 * 8 + lVar37 + 0x1a0) = auVar41;
          *(undefined1 (*) [32])((long)pvVar2 + lVar25 * 8 + lVar37 + 0x1c0) = auVar60;
          *(undefined1 (*) [32])((long)pvVar2 + lVar25 * 8 + lVar37 + 0x1e0) = auVar40;
          puVar31 = puVar31 + 0x100;
          lVar25 = lVar25 + 0x40;
          lVar10 = lVar10 + 0x10;
        }
        for (; iVar8 + 7 < _w; iVar8 = iVar8 + 8) {
          auVar63 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_f8.data + lVar25 + lVar22),3);
          auVar64 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_f8.data + lVar25 + lVar19),3);
          auVar65 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_f8.data + lVar25 + lVar16),3);
          auVar66 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_f8.data + lVar25 + lVar14),3);
          auVar67 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_f8.data + lVar25 + lVar38),3);
          auVar69 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_f8.data + lVar25 + lVar12),3);
          auVar71 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_f8.data + lVar25 + lVar35),3);
          auVar68 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_f8.data + lVar25 + lVar33),3);
          auVar70 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_f8.data + lVar25 + lVar32),3);
          auVar72 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_f8.data + lVar25 + lVar28),3);
          auVar73 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_f8.data + lVar25 + lVar26),3);
          auVar75 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_f8.data + lVar25 + lVar23),3);
          auVar76 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_f8.data + lVar25 + lVar20),3);
          auVar78 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_f8.data + lVar25 + lVar17),3);
          auVar79 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_f8.data + lVar25 + lVar15),3);
          auVar80 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_f8.data + lVar25 + lVar39),3);
          auVar55._0_16_ = ZEXT116(0) * auVar70 + ZEXT116(1) * auVar63;
          auVar55._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar70;
          auVar56._0_16_ = ZEXT116(0) * auVar72 + ZEXT116(1) * auVar64;
          auVar56._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar72;
          auVar57._0_16_ = ZEXT116(0) * auVar73 + ZEXT116(1) * auVar65;
          auVar57._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar73;
          auVar58._0_16_ = ZEXT116(0) * auVar75 + ZEXT116(1) * auVar66;
          auVar58._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar75;
          auVar59._0_16_ = ZEXT116(0) * auVar76 + ZEXT116(1) * auVar67;
          auVar59._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar76;
          auVar60._0_16_ = ZEXT116(0) * auVar78 + ZEXT116(1) * auVar69;
          auVar60._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar78;
          auVar61._0_16_ = ZEXT116(0) * auVar79 + ZEXT116(1) * auVar71;
          auVar61._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar79;
          auVar62._0_16_ = ZEXT116(0) * auVar80 + ZEXT116(1) * auVar68;
          auVar62._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar80;
          auVar40 = vpunpcklwd_avx2(auVar55,auVar56);
          auVar55 = vpunpckhwd_avx2(auVar55,auVar56);
          auVar41 = vpunpcklwd_avx2(auVar57,auVar58);
          auVar56 = vpunpckhwd_avx2(auVar57,auVar58);
          auVar42 = vpunpcklwd_avx2(auVar59,auVar60);
          auVar57 = vpunpckhwd_avx2(auVar59,auVar60);
          auVar59 = vpunpcklwd_avx2(auVar61,auVar62);
          auVar58 = vpunpckhwd_avx2(auVar61,auVar62);
          auVar60 = vpunpckldq_avx2(auVar40,auVar41);
          auVar40 = vpunpckhdq_avx2(auVar40,auVar41);
          auVar41 = vpunpckldq_avx2(auVar55,auVar56);
          auVar55 = vpunpckhdq_avx2(auVar55,auVar56);
          auVar61 = vpunpckldq_avx2(auVar42,auVar59);
          auVar56 = vpunpckhdq_avx2(auVar42,auVar59);
          auVar42 = vpunpckldq_avx2(auVar57,auVar58);
          auVar57 = vpunpckhdq_avx2(auVar57,auVar58);
          auVar59 = vpunpcklqdq_avx2(auVar60,auVar61);
          auVar58 = vpunpckhqdq_avx2(auVar60,auVar61);
          auVar60 = vpunpcklqdq_avx2(auVar40,auVar56);
          auVar56 = vpunpckhqdq_avx2(auVar40,auVar56);
          auVar61 = vpunpcklqdq_avx2(auVar41,auVar42);
          auVar40 = vpunpckhqdq_avx2(auVar41,auVar42);
          auVar41 = vpunpcklqdq_avx2(auVar55,auVar57);
          auVar55 = vpunpckhqdq_avx2(auVar55,auVar57);
          *(undefined1 (*) [32])((long)pvVar2 + lVar25 * 8 + lVar37) = auVar59;
          *(undefined1 (*) [32])((long)pvVar2 + lVar25 * 8 + lVar37 + 0x20) = auVar58;
          *(undefined1 (*) [32])((long)pvVar2 + lVar25 * 8 + lVar37 + 0x40) = auVar60;
          *(undefined1 (*) [32])((long)pvVar2 + lVar25 * 8 + lVar37 + 0x60) = auVar56;
          *(undefined1 (*) [32])((long)pvVar2 + lVar25 * 8 + lVar37 + 0x80) = auVar61;
          *(undefined1 (*) [32])((long)pvVar2 + lVar25 * 8 + lVar37 + 0xa0) = auVar40;
          *(undefined1 (*) [32])((long)pvVar2 + lVar25 * 8 + lVar37 + 0xc0) = auVar41;
          *(undefined1 (*) [32])((long)pvVar2 + lVar25 * 8 + lVar37 + 0xe0) = auVar55;
          puVar31 = puVar31 + 0x80;
          lVar25 = lVar25 + 0x20;
          lVar10 = lVar10 + 8;
        }
        lVar37 = local_f8.elemsize * local_b0;
        local_78 = lVar34;
        local_70 = lVar13;
        local_68 = lVar11;
        local_60 = lVar9;
        local_58 = lVar7;
        local_50 = lVar27;
        local_48 = lVar24;
        local_40 = lVar21;
        local_38 = lVar18;
        for (; (int)lVar10 < _w; lVar10 = lVar10 + 1) {
          pfVar36 = (float *)((long)pvVar5 + lVar10 * 4 + lVar37 * uVar29);
          uVar6 = float32_to_float16(*pfVar36);
          *puVar31 = uVar6;
          uVar6 = float32_to_float16(*(float *)((long)pfVar36 + lVar37));
          puVar31[1] = uVar6;
          uVar6 = float32_to_float16(*(float *)((long)pfVar36 + lVar37 * 2));
          puVar31[2] = uVar6;
          uVar6 = float32_to_float16(*(float *)((long)pfVar36 + lVar37 * 3));
          puVar31[3] = uVar6;
          uVar6 = float32_to_float16(pfVar36[lVar37]);
          puVar31[4] = uVar6;
          uVar6 = float32_to_float16(*(float *)((long)pfVar36 + lVar37 * 5));
          puVar31[5] = uVar6;
          uVar6 = float32_to_float16(*(float *)((long)pfVar36 + lVar37 * 6));
          puVar31[6] = uVar6;
          uVar6 = float32_to_float16(*(float *)((long)pfVar36 + lVar37 * 7));
          puVar31[7] = uVar6;
          uVar6 = float32_to_float16(pfVar36[lVar37 * 2]);
          puVar31[8] = uVar6;
          uVar6 = float32_to_float16(*(float *)((long)pfVar36 + lVar37 * 9));
          puVar31[9] = uVar6;
          uVar6 = float32_to_float16(*(float *)((long)pfVar36 + lVar37 * 10));
          puVar31[10] = uVar6;
          uVar6 = float32_to_float16(*(float *)((long)pfVar36 + lVar37 * 0xb));
          puVar31[0xb] = uVar6;
          uVar6 = float32_to_float16(pfVar36[lVar37 * 3]);
          puVar31[0xc] = uVar6;
          uVar6 = float32_to_float16(*(float *)((long)pfVar36 + lVar37 * 0xd));
          puVar31[0xd] = uVar6;
          uVar6 = float32_to_float16(*(float *)((long)pfVar36 + lVar37 * 0xe));
          puVar31[0xe] = uVar6;
          uVar6 = float32_to_float16(*(float *)((long)pfVar36 + lVar37 * 0xf));
          puVar31[0xf] = uVar6;
          puVar31 = puVar31 + 0x10;
        }
        lVar21 = local_40 + 0x10;
        lVar24 = local_48 + 0x10;
        lVar27 = local_50 + 0x10;
        lVar7 = local_58 + 0x10;
        lVar9 = local_60 + 0x10;
        lVar11 = local_68 + 0x10;
        lVar13 = local_70 + 0x10;
        lVar18 = local_38 + 0x10;
        lVar34 = local_78 + 0x10;
        local_120 = local_120 + 0x10;
        local_128 = local_128 + 0x10;
        local_130 = local_130 + 0x10;
        local_138 = local_138 + 0x10;
        local_88 = local_88 + 0x10;
        local_90 = local_90 + 0x10;
        local_98 = local_98 + 1;
        uVar30 = local_a0;
      }
      if (local_f8.refcount == (int *)0x0) goto LAB_002a1bde;
      LOCK();
      *local_f8.refcount = *local_f8.refcount + -1;
      UNLOCK();
      if (*local_f8.refcount != 0) goto LAB_002a1bde;
      if (local_f8.allocator != (Allocator *)0x0) {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
        goto LAB_002a1bde;
      }
    }
    else if ((_h & 7) == 0) {
      Mat::reshape(&local_f8,this_01,_w,_h,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)_h >> 3,0x10,8,(Allocator *)0x0);
      lVar18 = 7;
      lVar21 = 6;
      lVar24 = 5;
      lVar27 = 4;
      lVar7 = 3;
      lVar9 = 2;
      lVar11 = 1;
      lVar13 = 0;
      for (uVar29 = 0; pvVar5 = local_f8.data, (long)(uVar29 | 7) < (long)uVar30;
          uVar29 = uVar29 + 8) {
        pvVar2 = (this->weight_data_tm).data;
        sVar1 = (this->weight_data_tm).elemsize;
        lVar34 = (long)(this->weight_data_tm).w;
        puVar31 = (unsigned_short *)((uVar29 >> 3) * lVar34 * sVar1 + (long)pvVar2);
        lVar32 = (long)local_f8.w;
        lVar37 = local_f8.elemsize * lVar18 * lVar32;
        lVar15 = local_f8.elemsize * lVar21 * lVar32;
        lVar17 = local_f8.elemsize * lVar24 * lVar32;
        lVar20 = local_f8.elemsize * lVar27 * lVar32;
        lVar23 = local_f8.elemsize * lVar7 * lVar32;
        lVar26 = local_f8.elemsize * lVar9 * lVar32;
        lVar28 = local_f8.elemsize * lVar11 * lVar32;
        lVar39 = local_f8.elemsize * uVar29 * lVar32;
        lVar34 = sVar1 * lVar13 * lVar34;
        lVar38 = 0;
        lVar33 = 0;
        for (iVar8 = 0; iVar8 + 0xf < _w; iVar8 = iVar8 + 0x10) {
          auVar55 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8.data + lVar33 + lVar39),
                                      3);
          auVar56 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8.data + lVar33 + lVar28),
                                      3);
          auVar57 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8.data + lVar33 + lVar26),
                                      3);
          auVar58 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8.data + lVar33 + lVar23),
                                      3);
          auVar59 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8.data + lVar33 + lVar20),
                                      3);
          auVar60 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8.data + lVar33 + lVar17),
                                      3);
          auVar61 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8.data + lVar33 + lVar15),
                                      3);
          auVar62 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8.data + lVar33 + lVar37),
                                      3);
          auVar40 = vpunpcklwd_avx2(auVar55,auVar56);
          auVar55 = vpunpckhwd_avx2(auVar55,auVar56);
          auVar41 = vpunpcklwd_avx2(auVar57,auVar58);
          auVar56 = vpunpckhwd_avx2(auVar57,auVar58);
          auVar42 = vpunpcklwd_avx2(auVar59,auVar60);
          auVar57 = vpunpckhwd_avx2(auVar59,auVar60);
          auVar59 = vpunpcklwd_avx2(auVar61,auVar62);
          auVar58 = vpunpckhwd_avx2(auVar61,auVar62);
          auVar60 = vpunpckldq_avx2(auVar40,auVar41);
          auVar40 = vpunpckhdq_avx2(auVar40,auVar41);
          auVar41 = vpunpckldq_avx2(auVar55,auVar56);
          auVar55 = vpunpckhdq_avx2(auVar55,auVar56);
          auVar61 = vpunpckldq_avx2(auVar42,auVar59);
          auVar56 = vpunpckhdq_avx2(auVar42,auVar59);
          auVar42 = vpunpckldq_avx2(auVar57,auVar58);
          auVar57 = vpunpckhdq_avx2(auVar57,auVar58);
          auVar59 = vpunpcklqdq_avx2(auVar60,auVar61);
          auVar58 = vpunpckhqdq_avx2(auVar60,auVar61);
          auVar60 = vpunpcklqdq_avx2(auVar40,auVar56);
          auVar56 = vpunpckhqdq_avx2(auVar40,auVar56);
          auVar61 = vpunpcklqdq_avx2(auVar41,auVar42);
          auVar40 = vpunpckhqdq_avx2(auVar41,auVar42);
          auVar41 = vpunpcklqdq_avx2(auVar55,auVar57);
          auVar55 = vpunpckhqdq_avx2(auVar55,auVar57);
          auVar42._0_16_ = ZEXT116(0) * auVar58._0_16_ + ZEXT116(1) * auVar59._0_16_;
          auVar42._16_16_ = ZEXT116(0) * auVar59._16_16_ + ZEXT116(1) * auVar58._0_16_;
          auVar74._0_16_ = ZEXT116(0) * auVar56._0_16_ + ZEXT116(1) * auVar60._0_16_;
          auVar74._16_16_ = ZEXT116(0) * auVar60._16_16_ + ZEXT116(1) * auVar56._0_16_;
          auVar43._0_16_ = ZEXT116(0) * auVar40._0_16_ + ZEXT116(1) * auVar61._0_16_;
          auVar43._16_16_ = ZEXT116(0) * auVar61._16_16_ + ZEXT116(1) * auVar40._0_16_;
          auVar44._0_16_ = ZEXT116(0) * auVar55._0_16_ + ZEXT116(1) * auVar41._0_16_;
          auVar44._16_16_ = ZEXT116(0) * auVar41._16_16_ + ZEXT116(1) * auVar55._0_16_;
          auVar57 = vperm2i128_avx2(auVar59,auVar58,0x31);
          auVar56 = vperm2i128_avx2(auVar60,auVar56,0x31);
          auVar58 = vperm2i128_avx2(auVar61,auVar40,0x31);
          auVar55 = vperm2i128_avx2(auVar41,auVar55,0x31);
          *(undefined1 (*) [32])((long)pvVar2 + lVar33 * 4 + lVar34) = auVar42;
          *(undefined1 (*) [32])((long)pvVar2 + lVar33 * 4 + lVar34 + 0x20) = auVar74;
          *(undefined1 (*) [32])((long)pvVar2 + lVar33 * 4 + lVar34 + 0x40) = auVar43;
          *(undefined1 (*) [32])((long)pvVar2 + lVar33 * 4 + lVar34 + 0x60) = auVar44;
          *(undefined1 (*) [32])((long)pvVar2 + lVar33 * 4 + lVar34 + 0x80) = auVar57;
          *(undefined1 (*) [32])((long)pvVar2 + lVar33 * 4 + lVar34 + 0xa0) = auVar56;
          *(undefined1 (*) [32])((long)pvVar2 + lVar33 * 4 + lVar34 + 0xc0) = auVar58;
          *(undefined1 (*) [32])((long)pvVar2 + lVar33 * 4 + lVar34 + 0xe0) = auVar55;
          puVar31 = puVar31 + 0x80;
          lVar33 = lVar33 + 0x40;
          lVar38 = lVar38 + 0x10;
        }
        for (; iVar8 + 7 < _w; iVar8 = iVar8 + 8) {
          auVar63 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_f8.data + lVar33 + lVar39),3);
          auVar64 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_f8.data + lVar33 + lVar28),3);
          auVar65 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_f8.data + lVar33 + lVar26),3);
          auVar66 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_f8.data + lVar33 + lVar23),3);
          auVar68 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_f8.data + lVar33 + lVar20),3);
          auVar70 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_f8.data + lVar33 + lVar17),3);
          auVar72 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_f8.data + lVar33 + lVar15),3);
          auVar73 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_f8.data + lVar33 + lVar37),3);
          auVar67 = vpunpcklwd_avx(auVar63,auVar64);
          auVar63 = vpunpckhwd_avx(auVar63,auVar64);
          auVar69 = vpunpcklwd_avx(auVar65,auVar66);
          auVar64 = vpunpckhwd_avx(auVar65,auVar66);
          auVar71 = vpunpcklwd_avx(auVar68,auVar70);
          auVar65 = vpunpckhwd_avx(auVar68,auVar70);
          auVar68 = vpunpcklwd_avx(auVar72,auVar73);
          auVar66 = vpunpckhwd_avx(auVar72,auVar73);
          auVar70 = vpunpckldq_avx(auVar67,auVar69);
          auVar67 = vpunpckhdq_avx(auVar67,auVar69);
          auVar69 = vpunpckldq_avx(auVar63,auVar64);
          auVar63 = vpunpckhdq_avx(auVar63,auVar64);
          auVar72 = vpunpckldq_avx(auVar71,auVar68);
          auVar64 = vpunpckhdq_avx(auVar71,auVar68);
          auVar71 = vpunpckldq_avx(auVar65,auVar66);
          auVar65 = vpunpckhdq_avx(auVar65,auVar66);
          auVar68 = vpunpcklqdq_avx(auVar70,auVar72);
          auVar66 = vpunpckhqdq_avx(auVar70,auVar72);
          auVar70 = vpunpcklqdq_avx(auVar67,auVar64);
          auVar64 = vpunpckhqdq_avx(auVar67,auVar64);
          auVar72 = vpunpcklqdq_avx(auVar69,auVar71);
          auVar67 = vpunpckhqdq_avx(auVar69,auVar71);
          auVar69 = vpunpcklqdq_avx(auVar63,auVar65);
          auVar63 = vpunpckhqdq_avx(auVar63,auVar65);
          *(undefined1 (*) [16])((long)pvVar2 + lVar33 * 4 + lVar34) = auVar68;
          *(undefined1 (*) [16])((long)pvVar2 + lVar33 * 4 + lVar34 + 0x10) = auVar66;
          *(undefined1 (*) [16])((long)pvVar2 + lVar33 * 4 + lVar34 + 0x20) = auVar70;
          *(undefined1 (*) [16])((long)pvVar2 + lVar33 * 4 + lVar34 + 0x30) = auVar64;
          *(undefined1 (*) [16])((long)pvVar2 + lVar33 * 4 + lVar34 + 0x40) = auVar72;
          *(undefined1 (*) [16])((long)pvVar2 + lVar33 * 4 + lVar34 + 0x50) = auVar67;
          *(undefined1 (*) [16])((long)pvVar2 + lVar33 * 4 + lVar34 + 0x60) = auVar69;
          *(undefined1 (*) [16])((long)pvVar2 + lVar33 * 4 + lVar34 + 0x70) = auVar63;
          puVar31 = puVar31 + 0x40;
          lVar33 = lVar33 + 0x20;
          lVar38 = lVar38 + 8;
        }
        lVar32 = local_f8.elemsize * lVar32;
        for (; (int)lVar38 < _w; lVar38 = lVar38 + 1) {
          pfVar36 = (float *)((long)pvVar5 + lVar38 * 4 + lVar32 * uVar29);
          uVar6 = float32_to_float16(*pfVar36);
          *puVar31 = uVar6;
          uVar6 = float32_to_float16(*(float *)((long)pfVar36 + lVar32));
          puVar31[1] = uVar6;
          uVar6 = float32_to_float16(*(float *)((long)pfVar36 + lVar32 * 2));
          puVar31[2] = uVar6;
          uVar6 = float32_to_float16(*(float *)((long)pfVar36 + lVar32 * 3));
          puVar31[3] = uVar6;
          uVar6 = float32_to_float16(pfVar36[lVar32]);
          puVar31[4] = uVar6;
          uVar6 = float32_to_float16(*(float *)((long)pfVar36 + lVar32 * 5));
          puVar31[5] = uVar6;
          uVar6 = float32_to_float16(*(float *)((long)pfVar36 + lVar32 * 6));
          puVar31[6] = uVar6;
          uVar6 = float32_to_float16(*(float *)((long)pfVar36 + lVar32 * 7));
          puVar31[7] = uVar6;
          puVar31 = puVar31 + 8;
        }
        lVar18 = lVar18 + 8;
        lVar21 = lVar21 + 8;
        lVar24 = lVar24 + 8;
        lVar27 = lVar27 + 8;
        lVar7 = lVar7 + 8;
        lVar9 = lVar9 + 8;
        lVar11 = lVar11 + 8;
        lVar13 = lVar13 + 1;
        uVar30 = local_a0;
      }
      if (local_f8.refcount == (int *)0x0) goto LAB_002a1bde;
      LOCK();
      *local_f8.refcount = *local_f8.refcount + -1;
      UNLOCK();
      if (*local_f8.refcount != 0) goto LAB_002a1bde;
      if (local_f8.allocator != (Allocator *)0x0) {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
        goto LAB_002a1bde;
      }
    }
    else {
      if ((_h & 3) != 0) goto LAB_002a0a29;
      Mat::reshape(&local_f8,this_01,_w,_h,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)_h >> 2,8,4,(Allocator *)0x0);
      lVar18 = 3;
      lVar21 = 2;
      lVar24 = 1;
      lVar27 = 0;
      for (uVar29 = 0; pvVar5 = local_f8.data, (long)(uVar29 | 3) < (long)uVar30;
          uVar29 = uVar29 + 4) {
        lVar9 = (long)local_f8.w;
        lVar11 = (this->weight_data_tm).elemsize * lVar27 * (long)(this->weight_data_tm).w;
        pvVar2 = (this->weight_data_tm).data;
        lVar13 = local_f8.elemsize * uVar29 * lVar9;
        lVar37 = local_f8.elemsize * lVar24 * lVar9;
        lVar39 = local_f8.elemsize * lVar21 * lVar9;
        lVar9 = local_f8.elemsize * lVar18 * lVar9;
        lVar34 = 0;
        lVar7 = 0;
        for (iVar8 = 0; iVar8 + 3 < _w; iVar8 = iVar8 + 4) {
          auVar63 = *(undefined1 (*) [16])((long)local_f8.data + lVar7 + lVar13);
          auVar64 = *(undefined1 (*) [16])((long)local_f8.data + lVar7 + lVar37);
          auVar65 = *(undefined1 (*) [16])((long)local_f8.data + lVar7 + lVar39);
          auVar66 = *(undefined1 (*) [16])((long)local_f8.data + lVar7 + lVar9);
          auVar67 = vpunpckldq_avx(auVar63,auVar64);
          auVar69 = vpunpckldq_avx(auVar65,auVar66);
          auVar63 = vpunpckhdq_avx(auVar63,auVar64);
          auVar64 = vpunpckhdq_avx(auVar65,auVar66);
          auVar66 = vpunpcklqdq_avx(auVar67,auVar69);
          auVar65 = vpunpckhqdq_avx(auVar67,auVar69);
          auVar67 = vpunpcklqdq_avx(auVar63,auVar64);
          auVar63 = vpunpckhqdq_avx(auVar63,auVar64);
          auVar41._0_16_ = ZEXT116(0) * auVar65 + ZEXT116(1) * auVar66;
          auVar41._16_16_ = ZEXT116(1) * auVar65;
          auVar40._0_16_ = ZEXT116(0) * auVar63 + ZEXT116(1) * auVar67;
          auVar40._16_16_ = ZEXT116(1) * auVar63;
          auVar63 = vcvtps2ph_f16c(auVar41,3);
          *(undefined1 (*) [16])((long)pvVar2 + lVar7 * 2 + lVar11) = auVar63;
          auVar63 = vcvtps2ph_f16c(auVar40,3);
          *(undefined1 (*) [16])((long)pvVar2 + lVar7 * 2 + lVar11 + 0x10) = auVar63;
          lVar7 = lVar7 + 0x10;
          lVar34 = lVar34 + 4;
        }
        for (; (int)lVar34 < _w; lVar34 = lVar34 + 1) {
          uVar6 = float32_to_float16(*(float *)((long)pvVar5 + lVar34 * 4 + lVar13));
          *(unsigned_short *)((long)pvVar2 + lVar34 * 8 + lVar11) = uVar6;
          uVar6 = float32_to_float16(*(float *)((long)pvVar5 + lVar34 * 4 + lVar37));
          *(unsigned_short *)((long)pvVar2 + lVar34 * 8 + lVar11 + 2) = uVar6;
          uVar6 = float32_to_float16(*(float *)((long)pvVar5 + lVar34 * 4 + lVar39));
          *(unsigned_short *)((long)pvVar2 + lVar34 * 8 + lVar11 + 4) = uVar6;
          uVar6 = float32_to_float16(*(float *)((long)pvVar5 + lVar34 * 4 + lVar9));
          *(unsigned_short *)((long)pvVar2 + lVar34 * 8 + lVar11 + 6) = uVar6;
        }
        lVar27 = lVar27 + 1;
        lVar24 = lVar24 + 4;
        lVar21 = lVar21 + 4;
        lVar18 = lVar18 + 4;
        uVar30 = local_a0;
      }
      if (local_f8.refcount == (int *)0x0) goto LAB_002a1bde;
      LOCK();
      *local_f8.refcount = *local_f8.refcount + -1;
      UNLOCK();
      if (*local_f8.refcount != 0) goto LAB_002a1bde;
      if (local_f8.allocator != (Allocator *)0x0) {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
        goto LAB_002a1bde;
      }
    }
  }
  else {
LAB_002a0a29:
    Mat::reshape(&local_f8,this_01,_w,_h,(Allocator *)0x0);
    cast_float32_to_float16(&local_f8,this_00,opt);
    if (local_f8.refcount == (int *)0x0) goto LAB_002a1bde;
    LOCK();
    *local_f8.refcount = *local_f8.refcount + -1;
    UNLOCK();
    if (*local_f8.refcount != 0) goto LAB_002a1bde;
    if (local_f8.allocator != (Allocator *)0x0) {
      (*(local_f8.allocator)->_vptr_Allocator[3])();
      goto LAB_002a1bde;
    }
  }
  free(local_f8.data);
LAB_002a1bde:
  if (local_80->lightmode == true) {
    p_Var3 = this->_vptr_InnerProduct_x86_avx512[-3];
    piVar4 = *(int **)(&this->field_0x138 + (long)p_Var3);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (*(long **)(&this->field_0x150 + (long)p_Var3) == (long *)0x0) {
          free(*(void **)(&this->field_0x130 + (long)p_Var3));
        }
        else {
          (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var3) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x170 + (long)p_Var3) = 0;
    *(undefined8 *)(&this->field_0x13c + (long)p_Var3) = 0;
    *(undefined8 *)(&this->field_0x144 + (long)p_Var3) = 0;
    *(undefined8 *)(&this->field_0x130 + (long)p_Var3) = 0;
    *(undefined8 *)(&this->field_0x138 + (long)p_Var3) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var3) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var3) = 0;
    *(undefined4 *)(&this->field_0x168 + (long)p_Var3) = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx512::create_pipeline_fp16s(const Option& opt)
{
    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_fp16s_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}